

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# core.h
# Opt level: O1

void __thiscall
fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::
padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
::operator()(padded_int_writer<fmt::v5::basic_writer<fmt::v5::back_insert_range<fmt::v5::internal::basic_buffer<wchar_t>>>::int_writer<long_long,fmt::v5::basic_format_specs<wchar_t>>::bin_writer<3>>
             *this,wchar_t **it)

{
  wchar_t wVar1;
  bool bVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  wchar_t *pwVar6;
  wchar_t *pwVar7;
  long lVar8;
  char *pcVar9;
  ulong uVar10;
  long lVar11;
  int iVar13;
  undefined1 auVar12 [16];
  undefined1 auVar14 [16];
  int iVar16;
  undefined1 auVar15 [16];
  
  lVar8 = *(long *)(this + 0x10);
  if (lVar8 != 0) {
    pwVar6 = *it;
    if (0 < lVar8) {
      pcVar9 = *(char **)(this + 8);
      lVar8 = lVar8 + 1;
      do {
        *pwVar6 = (int)*pcVar9;
        pcVar9 = pcVar9 + 1;
        pwVar6 = pwVar6 + 1;
        lVar8 = lVar8 + -1;
      } while (1 < lVar8);
    }
    *it = pwVar6;
  }
  auVar5 = _DAT_00160270;
  auVar4 = _DAT_00160260;
  auVar3 = _DAT_00160250;
  pwVar7 = *it;
  lVar8 = *(long *)(this + 0x20);
  pwVar6 = pwVar7;
  if (lVar8 != 0) {
    pwVar6 = pwVar7 + lVar8;
    wVar1 = *(wchar_t *)(this + 0x18);
    uVar10 = lVar8 + 0x3fffffffffffffffU & 0x3fffffffffffffff;
    auVar12._8_4_ = (int)uVar10;
    auVar12._0_8_ = uVar10;
    auVar12._12_4_ = (int)(uVar10 >> 0x20);
    lVar11 = 0;
    auVar12 = auVar12 ^ _DAT_00160270;
    do {
      auVar14._8_4_ = (int)lVar11;
      auVar14._0_8_ = lVar11;
      auVar14._12_4_ = (int)((ulong)lVar11 >> 0x20);
      auVar15 = (auVar14 | auVar4) ^ auVar5;
      iVar13 = auVar12._4_4_;
      if ((bool)(~(auVar15._4_4_ == iVar13 && auVar12._0_4_ < auVar15._0_4_ ||
                  iVar13 < auVar15._4_4_) & 1)) {
        pwVar7[lVar11] = wVar1;
      }
      if ((auVar15._12_4_ != auVar12._12_4_ || auVar15._8_4_ <= auVar12._8_4_) &&
          auVar15._12_4_ <= auVar12._12_4_) {
        pwVar7[lVar11 + 1] = wVar1;
      }
      auVar14 = (auVar14 | auVar3) ^ auVar5;
      iVar16 = auVar14._4_4_;
      if (iVar16 <= iVar13 && (iVar16 != iVar13 || auVar14._0_4_ <= auVar12._0_4_)) {
        pwVar7[lVar11 + 2] = wVar1;
        pwVar7[lVar11 + 3] = wVar1;
      }
      lVar11 = lVar11 + 4;
    } while ((uVar10 - ((uint)(lVar8 + 0x3fffffffffffffffU) & 3)) + 4 != lVar11);
  }
  *it = pwVar6;
  iVar13 = *(int *)(this + 0x30);
  pwVar7 = pwVar6 + iVar13;
  uVar10 = *(ulong *)(this + 0x28);
  do {
    pwVar7 = pwVar7 + -1;
    *pwVar7 = (uint)uVar10 & 7 | 0x30;
    bVar2 = 7 < uVar10;
    uVar10 = uVar10 >> 3;
  } while (bVar2);
  *it = pwVar6 + iVar13;
  return;
}

Assistant:

FMT_CONSTEXPR iterator begin() const { return data_; }